

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

QString * __thiscall
QAccessibleTextWidget::text
          (QString *__return_storage_ptr__,QAccessibleTextWidget *this,int startOffset,int endOffset
          )

{
  Data *pDVar1;
  long *plVar2;
  int iVar3;
  long in_FS_OFFSET;
  QTextCursor cursor;
  QArrayData *local_48 [3];
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x158))(&local_30);
  iVar3 = (int)&local_30;
  QTextCursor::setPosition(iVar3,startOffset);
  QTextCursor::setPosition(iVar3,endOffset);
  QTextCursor::selectedText();
  plVar2 = (long *)QString::replace((QChar)(char16_t)local_48,(QChar)0x2029,10);
  pDVar1 = (Data *)*plVar2;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (char16_t *)plVar2[1];
  (__return_storage_ptr__->d).size = plVar2[2];
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTextWidget::text(int startOffset, int endOffset) const
{
    QTextCursor cursor(textCursor());

    cursor.setPosition(startOffset, QTextCursor::MoveAnchor);
    cursor.setPosition(endOffset, QTextCursor::KeepAnchor);

    return cursor.selectedText().replace(QChar(QChar::ParagraphSeparator), u'\n');
}